

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O3

void do_ds(int *ip)

{
  int offset;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  long lVar6;
  ulong __n;
  long lVar7;
  
  labldef(loccnt,1);
  iVar2 = evaluate(ip,';');
  iVar1 = section;
  offset = loccnt;
  if (iVar2 == 0) {
    return;
  }
  if (section - 2U < 2) {
    uVar4 = 0x2000;
  }
  else if (section == 1) {
    uVar4 = machine->ram_limit;
  }
  else {
    uVar4 = 0;
    if (section == 0) {
      uVar4 = machine->zp_limit;
    }
  }
  lVar6 = (long)loccnt;
  __n = (ulong)value;
  uVar3 = value + loccnt;
  if (uVar4 < uVar3) {
    error("Out of range!");
    return;
  }
  if (section == 1) {
    piVar5 = &max_bss;
  }
  else {
    if (section != 0) goto LAB_0010b1e7;
    piVar5 = &max_zp;
  }
  if (*piVar5 < (int)uVar3) {
    *piVar5 = uVar3;
  }
LAB_0010b1e7:
  iVar2 = bank;
  if (pass == 1) {
    if ((iVar1 & 0xfffffffeU) == 2) {
      lVar7 = (long)bank;
      memset(rom[lVar7] + lVar6,0,__n);
      memset(map[lVar7] + lVar6,page << 5 | iVar1,__n);
      if (max_bank < iVar2) {
        max_bank = iVar2;
      }
    }
    loadlc(offset,0);
    println();
    uVar3 = loccnt + value;
  }
  loccnt = uVar3;
  return;
}

Assistant:

void
do_ds(int *ip)
{
	unsigned int limit = 0;
	int addr;

	/* define label */
	labldef(loccnt, 1);

	/* get the number of bytes to reserve */
	if (!evaluate(ip, ';'))
		return;

	/* section switch */
	switch (section) {
	case S_ZP:
		/* zero page section */
		limit = machine->zp_limit;
		break;

	case S_BSS:
		/* ram section */
		limit = machine->ram_limit;
		break;

	case S_CODE:
	case S_DATA:
		/* code and data sections */
		limit = 0x2000;
		break;
	}

	/* check range */
	if ((loccnt + value) > limit) {
		error("Out of range!");
		return;
	}

	/* update max counter for zp and bss sections */
	addr = loccnt + value;

	switch (section) {
	case S_ZP:
		/* zero page */
		if (addr > max_zp)
			max_zp = addr;
		break;

	case S_BSS:
		/* ram page */
		if (addr > max_bss)
			max_bss = addr;
		break;
	}

	/* output line on last pass */
	if (pass == LAST_PASS) {
		switch (section) {
		case S_CODE:
		case S_DATA:
			memset(&rom[bank][loccnt], 0, value);
			memset(&map[bank][loccnt], section + (page << 5), value);
			if (bank > max_bank)
				max_bank = bank;
			break;
		}
		loadlc(loccnt, 0);
		println();
	}

	/* update location counter */
	loccnt += value;
}